

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_messenger.cpp
# Opt level: O2

void __thiscall
cppcms::impl::messenger::transmit(messenger *this,tcp_operation_header *h,string *data)

{
  stream_socket *psVar1;
  endpoint ep;
  vector<char,_std::allocator<char>_> d;
  allocator_type local_98 [24];
  _Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  local_80;
  string *local_68;
  const_buffer packet;
  
  psVar1 = &this->socket_;
  local_68 = &this->ip_;
  booster::aio::buffer((mutable_buffer *)local_98,h,0x28);
  booster::aio::const_buffer::const_buffer(&packet,(mutable_buffer *)local_98);
  std::
  _Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ::~_Vector_base(&local_80);
  if ((ulong)h->size != 0) {
    booster::aio::buffer((const_buffer *)local_98,(data->_M_dataplus)._M_p,(ulong)h->size);
    booster::aio::details::add<booster::aio::const_buffer>(&packet,(const_buffer *)local_98);
    std::
    _Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ::~_Vector_base((_Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                     *)&local_80);
  }
  booster::aio::stream_socket::write((const_buffer *)psVar1);
  booster::aio::buffer((mutable_buffer *)local_98,h,0x28);
  booster::aio::stream_socket::read((mutable_buffer *)psVar1);
  std::
  _Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ::~_Vector_base(&local_80);
  if ((ulong)h->size == 0) {
    data->_M_string_length = 0;
    *(data->_M_dataplus)._M_p = '\0';
  }
  else {
    std::vector<char,_std::allocator<char>_>::vector(&d,(ulong)h->size,local_98);
    booster::aio::buffer((mutable_buffer *)local_98,&d);
    booster::aio::stream_socket::read((mutable_buffer *)psVar1);
    std::
    _Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ::~_Vector_base(&local_80);
    std::__cxx11::string::
    assign<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((string *)data,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               d.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                        (d.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start + h->size));
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&d.super__Vector_base<char,_std::allocator<char>_>);
  }
  std::
  _Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ::~_Vector_base(&packet.super_buffer_impl<const_char_*>.vec_.
                   super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                 );
  return;
}

Assistant:

void messenger::transmit(tcp_operation_header &h,std::string &data)
{
	bool done=false;
	int times=0;
	do {
		try {
			booster::aio::const_buffer packet = booster::aio::buffer(&h,sizeof(h));
			if(h.size > 0)
				packet += booster::aio::buffer(data.c_str(),h.size);
				
			socket_.write(packet);
			socket_.read(booster::aio::buffer(&h,sizeof(h)));
			if(h.size>0) {
				std::vector<char> d(h.size);
				socket_.read(booster::aio::buffer(d));
				data.assign(d.begin(),d.begin()+h.size);
			}
			else {
				data.clear();
			}
			done=true;
		}
		catch(booster::system::system_error const &e) {
			if(times) {
				throw cppcms_error(std::string("tcp_cache:")+e.what());
			}
			socket_.close();
			booster::aio::endpoint ep(ip_,port_);
			booster::system::error_code er;
			socket_.open(ep.family(),er);
			if(!er)
				socket_.connect(ep,er);
			if(er) throw cppcms_error("reconnect:"+er.message());
			times++;
		}
	}while(!done);
}